

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O1

DecodeStatus DecodeMSA128Mem(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  MCRegisterClass *pMVar4;
  int iVar5;
  
  iVar5 = (int)(Insn << 6) >> 0x16;
  pMVar4 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Address,0x2a);
  uVar1 = *(ushort *)((long)pMVar4->RegsBegin + (ulong)(Insn >> 5 & 0x3e));
  pMVar4 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Address,8);
  uVar2 = *(ushort *)((long)pMVar4->RegsBegin + (ulong)(Insn >> 10 & 0x3e));
  MCOperand_CreateReg0(Inst,(uint)uVar1);
  MCOperand_CreateReg0(Inst,(uint)uVar2);
  uVar3 = MCInst_getOpcode(Inst);
  switch(uVar3) {
  case 0x395:
    break;
  case 0x396:
switchD_0018d9bc_caseD_5f9:
    iVar5 = iVar5 << 3;
    break;
  case 0x397:
switchD_0018d9bc_caseD_5fa:
    iVar5 = iVar5 * 2;
    break;
  case 0x398:
switchD_0018d9bc_caseD_5fb:
    iVar5 = iVar5 << 2;
    break;
  default:
    switch(uVar3) {
    case 0x5f8:
      break;
    case 0x5f9:
      goto switchD_0018d9bc_caseD_5f9;
    case 0x5fa:
      goto switchD_0018d9bc_caseD_5fa;
    case 0x5fb:
      goto switchD_0018d9bc_caseD_5fb;
    default:
      return MCDisassembler_Fail;
    }
  }
  MCOperand_CreateImm0(Inst,(long)iVar5);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMSA128Mem(MCInst *Inst, unsigned Insn,
		uint64_t Address, MCRegisterInfo *Decoder)
{
	int Offset = SignExtend32(fieldFromInstruction(Insn, 16, 10), 10);
	unsigned Reg = fieldFromInstruction(Insn, 6, 5);
	unsigned Base = fieldFromInstruction(Insn, 11, 5);

	Reg = getReg(Decoder, Mips_MSA128BRegClassID, Reg);
	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	MCOperand_CreateReg0(Inst, Reg);
	MCOperand_CreateReg0(Inst, Base);
	// MCOperand_CreateImm0(Inst, Offset);

	// The immediate field of an LD/ST instruction is scaled which means it must
	// be multiplied (when decoding) by the size (in bytes) of the instructions'
	// data format.
	// .b - 1 byte
	// .h - 2 bytes
	// .w - 4 bytes
	// .d - 8 bytes
	switch(MCInst_getOpcode(Inst)) {
		default:
			//assert (0 && "Unexpected instruction");
			return MCDisassembler_Fail;
			break;
		case Mips_LD_B:
		case Mips_ST_B:
			MCOperand_CreateImm0(Inst, Offset);
			break;
		case Mips_LD_H:
		case Mips_ST_H:
			MCOperand_CreateImm0(Inst, Offset * 2);
			break;
		case Mips_LD_W:
		case Mips_ST_W:
			MCOperand_CreateImm0(Inst, Offset * 4);
			break;
		case Mips_LD_D:
		case Mips_ST_D:
			MCOperand_CreateImm0(Inst, Offset * 8);
			break;
	}

	return MCDisassembler_Success;
}